

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

CFeeRate __thiscall
CBlockPolicyEstimator::estimateSmartFee
          (CBlockPolicyEstimator *this,int confTarget,FeeCalculation *feeCalc,bool conservative)

{
  TxConfirmStats *pTVar1;
  uint uVar2;
  longlong lVar3;
  long lVar4;
  EstimationResult *pEVar5;
  FeeCalculation *pFVar6;
  uint confTarget_00;
  long in_FS_OFFSET;
  byte bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock5;
  double local_c8;
  EstimationResult local_b8;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  bVar7 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device = &(this->m_cs_fee_estimator).super_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  if (feeCalc != (FeeCalculation *)0x0) {
    feeCalc->desiredTarget = confTarget;
    feeCalc->returnedTarget = confTarget;
  }
  local_b8.pass.start = -1.0;
  local_b8.pass.end = -1.0;
  local_b8.pass.withinTarget = 0.0;
  local_b8.pass.totalConfirmed = 0.0;
  local_b8.pass.inMempool = 0.0;
  local_b8.pass.leftMempool = 0.0;
  local_b8.fail.start = -1.0;
  local_b8.fail.end = -1.0;
  local_b8.fail.withinTarget = 0.0;
  local_b8.fail.totalConfirmed = 0.0;
  local_b8.fail.inMempool = 0.0;
  local_b8.fail.leftMempool._0_4_ = 0;
  local_b8.fail.leftMempool._4_4_ = 0;
  local_b8.decay._0_4_ = 0;
  local_b8._100_8_ = 0;
  if ((0 < confTarget) &&
     (pTVar1 = (this->longStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,
     (uint)confTarget <=
     (int)((ulong)((long)*(pointer *)
                          ((long)&(pTVar1->confAvg).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          + 8) -
                  *(long *)&(pTVar1->confAvg).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl) >> 3) * pTVar1->scale * -0x55555555)) {
    uVar2 = MaxUsableEstimate(this);
    confTarget_00 = 2;
    if (confTarget != 1) {
      confTarget_00 = confTarget;
    }
    if (uVar2 <= confTarget_00) {
      confTarget_00 = uVar2;
    }
    if (feeCalc != (FeeCalculation *)0x0) {
      feeCalc->returnedTarget = confTarget_00;
    }
    if (1 < (int)confTarget_00) {
      dVar8 = estimateCombinedFee(this,confTarget_00 >> 1,0.6,true,&local_b8);
      if (feeCalc != (FeeCalculation *)0x0) {
        pEVar5 = &local_b8;
        pFVar6 = feeCalc;
        for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pFVar6->est).pass.start = (pEVar5->pass).start;
          pEVar5 = (EstimationResult *)((long)pEVar5 + ((ulong)bVar7 * -2 + 1) * 8);
          pFVar6 = (FeeCalculation *)((long)pFVar6 + (ulong)bVar7 * -0x10 + 8);
        }
        (feeCalc->est).scale = local_b8.scale;
        feeCalc->reason = HALF_ESTIMATE;
      }
      dVar9 = estimateCombinedFee(this,confTarget_00,0.85,true,&local_b8);
      dVar10 = dVar9;
      if (dVar9 <= dVar8) {
        dVar10 = dVar8;
      }
      if ((feeCalc != (FeeCalculation *)0x0) && (dVar8 < dVar9)) {
        pEVar5 = &local_b8;
        pFVar6 = feeCalc;
        for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pFVar6->est).pass.start = (pEVar5->pass).start;
          pEVar5 = (EstimationResult *)((long)pEVar5 + ((ulong)bVar7 * -2 + 1) * 8);
          pFVar6 = (FeeCalculation *)((long)pFVar6 + (ulong)bVar7 * -0x10 + 8);
        }
        (feeCalc->est).scale = local_b8.scale;
        feeCalc->reason = FULL_ESTIMATE;
        dVar10 = dVar9;
      }
      dVar8 = estimateCombinedFee(this,confTarget_00 * 2,0.95,!conservative,&local_b8);
      local_c8 = dVar8;
      if (dVar8 <= dVar10) {
        local_c8 = dVar10;
      }
      if ((feeCalc != (FeeCalculation *)0x0) && (dVar10 < dVar8)) {
        pEVar5 = &local_b8;
        pFVar6 = feeCalc;
        for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pFVar6->est).pass.start = (pEVar5->pass).start;
          pEVar5 = (EstimationResult *)((long)pEVar5 + ((ulong)bVar7 * -2 + 1) * 8);
          pFVar6 = (FeeCalculation *)((long)pFVar6 + (ulong)bVar7 * -0x10 + 8);
        }
        (feeCalc->est).scale = local_b8.scale;
        feeCalc->reason = DOUBLE_ESTIMATE;
        local_c8 = dVar8;
      }
      dVar8 = local_c8;
      if (local_c8 == -1.0 || conservative) {
        dVar10 = estimateConservativeFee(this,confTarget_00 * 2,&local_b8);
        dVar8 = dVar10;
        if (dVar10 <= local_c8) {
          dVar8 = local_c8;
        }
        if ((feeCalc != (FeeCalculation *)0x0) && (local_c8 < dVar10)) {
          pEVar5 = &local_b8;
          pFVar6 = feeCalc;
          for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
            (pFVar6->est).pass.start = (pEVar5->pass).start;
            pEVar5 = (EstimationResult *)((long)pEVar5 + ((ulong)bVar7 * -2 + 1) * 8);
            pFVar6 = (FeeCalculation *)((long)pFVar6 + (ulong)bVar7 * -0x10 + 8);
          }
          (feeCalc->est).scale = local_b8.scale;
          feeCalc->reason = CONSERVATIVE;
          dVar8 = dVar10;
        }
      }
      if (0.0 <= dVar8) {
        lVar3 = llround(dVar8);
        goto LAB_00284a5b;
      }
    }
  }
  lVar3 = 0;
LAB_00284a5b:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (CFeeRate)lVar3;
  }
  __stack_chk_fail();
}

Assistant:

CFeeRate CBlockPolicyEstimator::estimateSmartFee(int confTarget, FeeCalculation *feeCalc, bool conservative) const
{
    LOCK(m_cs_fee_estimator);

    if (feeCalc) {
        feeCalc->desiredTarget = confTarget;
        feeCalc->returnedTarget = confTarget;
    }

    double median = -1;
    EstimationResult tempResult;

    // Return failure if trying to analyze a target we're not tracking
    if (confTarget <= 0 || (unsigned int)confTarget > longStats->GetMaxConfirms()) {
        return CFeeRate(0);  // error condition
    }

    // It's not possible to get reasonable estimates for confTarget of 1
    if (confTarget == 1) confTarget = 2;

    unsigned int maxUsableEstimate = MaxUsableEstimate();
    if ((unsigned int)confTarget > maxUsableEstimate) {
        confTarget = maxUsableEstimate;
    }
    if (feeCalc) feeCalc->returnedTarget = confTarget;

    if (confTarget <= 1) return CFeeRate(0); // error condition

    assert(confTarget > 0); //estimateCombinedFee and estimateConservativeFee take unsigned ints
    /** true is passed to estimateCombined fee for target/2 and target so
     * that we check the max confirms for shorter time horizons as well.
     * This is necessary to preserve monotonically increasing estimates.
     * For non-conservative estimates we do the same thing for 2*target, but
     * for conservative estimates we want to skip these shorter horizons
     * checks for 2*target because we are taking the max over all time
     * horizons so we already have monotonically increasing estimates and
     * the purpose of conservative estimates is not to let short term
     * fluctuations lower our estimates by too much.
     */
    double halfEst = estimateCombinedFee(confTarget/2, HALF_SUCCESS_PCT, true, &tempResult);
    if (feeCalc) {
        feeCalc->est = tempResult;
        feeCalc->reason = FeeReason::HALF_ESTIMATE;
    }
    median = halfEst;
    double actualEst = estimateCombinedFee(confTarget, SUCCESS_PCT, true, &tempResult);
    if (actualEst > median) {
        median = actualEst;
        if (feeCalc) {
            feeCalc->est = tempResult;
            feeCalc->reason = FeeReason::FULL_ESTIMATE;
        }
    }
    double doubleEst = estimateCombinedFee(2 * confTarget, DOUBLE_SUCCESS_PCT, !conservative, &tempResult);
    if (doubleEst > median) {
        median = doubleEst;
        if (feeCalc) {
            feeCalc->est = tempResult;
            feeCalc->reason = FeeReason::DOUBLE_ESTIMATE;
        }
    }

    if (conservative || median == -1) {
        double consEst =  estimateConservativeFee(2 * confTarget, &tempResult);
        if (consEst > median) {
            median = consEst;
            if (feeCalc) {
                feeCalc->est = tempResult;
                feeCalc->reason = FeeReason::CONSERVATIVE;
            }
        }
    }

    if (median < 0) return CFeeRate(0); // error condition

    return CFeeRate(llround(median));
}